

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O0

int CVodeGetEstLocalErrors(void *cvode_mem,N_Vector ele)

{
  realtype in_RDI;
  CVodeMem cv_mem;
  N_Vector in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0.0) {
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeGetEstLocalErrors","cvode_mem = NULL illegal.")
    ;
    local_4 = -0x15;
  }
  else {
    N_VScale(in_RDI,in_stack_ffffffffffffffd8,(N_Vector)0x11975dd);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetEstLocalErrors(void *cvode_mem, N_Vector ele)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeGetEstLocalErrors", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  N_VScale(ONE, cv_mem->cv_acor, ele);

  return(CV_SUCCESS);
}